

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QString * tabTextFor(QString *__return_storage_ptr__,QMdiSubWindow *subWindow)

{
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  QString *pQVar6;
  long in_FS_OFFSET;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QString local_68;
  QString local_48;
  QString *local_28;
  
  local_28 = *(QString **)(in_FS_OFFSET + 0x28);
  if (subWindow == (QMdiSubWindow *)0x0) {
    pQVar6 = *(QString **)(in_FS_OFFSET + 0x28);
    if (pQVar6 != local_28) goto LAB_0044010f;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::windowTitle(&local_48,&subWindow->super_QWidget);
    bVar5 = QWidget::isWindowModified(&subWindow->super_QWidget);
    if (bVar5) {
      QVar7.m_data = (char *)0x1;
      QVar7.m_size = (qsizetype)"[*]";
      QVar8.m_data = (char *)0x3;
      QVar8.m_size = (qsizetype)&local_48;
      QString::replace(QVar8,QVar7,0x66910e);
    }
    else {
      qt_setWindowTitle_helperHelper(&local_68,&local_48,&subWindow->super_QWidget);
      pcVar4 = local_48.d.ptr;
      pDVar3 = local_48.d.d;
      qVar2 = local_68.d.size;
      pDVar1 = local_68.d.d;
      local_68.d.d = local_48.d.d;
      local_48.d.d = pDVar1;
      local_48.d.ptr = local_68.d.ptr;
      local_68.d.ptr = pcVar4;
      local_68.d.size = local_48.d.size;
      local_48.d.size = qVar2;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
    }
    if ((undefined1 *)local_48.d.size == (undefined1 *)0x0) {
      QMetaObject::tr((char *)__return_storage_ptr__,(char *)&QMdiArea::staticMetaObject,0x6da893);
    }
    else {
      (__return_storage_ptr__->d).d = local_48.d.d;
      (__return_storage_ptr__->d).ptr = local_48.d.ptr;
      (__return_storage_ptr__->d).size = local_48.d.size;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar6 = *(QString **)(in_FS_OFFSET + 0x28);
    if (pQVar6 != local_28) {
LAB_0044010f:
      __stack_chk_fail();
    }
  }
  return pQVar6;
}

Assistant:

static inline QString tabTextFor(QMdiSubWindow *subWindow)
{
    if (!subWindow)
        return QString();

    QString title = subWindow->windowTitle();
    if (subWindow->isWindowModified()) {
        title.replace("[*]"_L1, "*"_L1);
    } else {
        extern QString qt_setWindowTitle_helperHelper(const QString&, const QWidget*);
        title = qt_setWindowTitle_helperHelper(title, subWindow);
    }

    return title.isEmpty() ? QMdiArea::tr("(Untitled)") : title;
}